

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::initClass(Forth *this)

{
  pointer puVar1;
  size_t sVar2;
  
  (this->dStack).top = 0;
  puVar1 = (this->dStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->dStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  (this->rStack).top = 0;
  puVar1 = (this->rStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->rStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  (this->returnStack).top = 0;
  puVar1 = (this->returnStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->returnStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  (this->controlStackLoops).top = 0;
  puVar1 = (this->controlStackLoops).stack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->controlStackLoops).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  (this->controlStackIf_Begin).top = 0;
  puVar1 = (this->controlStackIf_Begin).stack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->controlStackIf_Begin).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  (this->catchStack).top = 0;
  puVar1 = (this->catchStack).stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memset(puVar1,0,(long)(this->catchStack).stack.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1);
  do {
    sVar2 = RestoreInput(this);
  } while (sVar2 != 0);
  this->next_command = 0;
  this->InterpretState = InterpretSource;
  return;
}

Assistant:

void initClass(){
			// clear datastack
			dStack.resetStack();
			// clear return stack
			rStack.resetStack();
			returnStack.resetStack();
			// clear floating point stack
			// clear control stacks
			controlStackLoops.resetStack();
			// control stack for IF ELSE THEN Begin While Repeat Until Again
			controlStackIf_Begin.resetStack();
			// clear excepion stack
			catchStack.resetStack();
			// clear source/evaluation stack
			while (RestoreInput()); // returns depth of the stack decremented by 1 every call . Or returns 0; 
			// next operation to 0
			next_command = 0;
			// interpretation state
			InterpretState = InterpretSource;
			// SOURCE-ID =0
		}